

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O0

ConsCell * find_cdrpair_in_page(conspage *pg,LispPTR carpart,LispPTR cdrpart)

{
  uint uVar1;
  ConsCell *pCVar2;
  LispPTR *pLVar3;
  uint *puVar4;
  ConsCell *cdrcell_1;
  ConsCell *carcell_1;
  ConsCell *cdrcell;
  ConsCell *carcell;
  uint noffset;
  uint poffset;
  uint nprior;
  uint priorprior;
  uint prior;
  uint offset;
  LispPTR cdrpart_local;
  LispPTR carpart_local;
  conspage *pg_local;
  
  noffset = 0;
  poffset = 0;
  nprior = 0;
  if (1 < *(uint *)&pg->field_0x8 >> 0x18) {
    for (priorprior = *(uint *)&pg->field_0x8 >> 0x10 & 0xff; priorprior != 0;
        priorprior = *(uint *)((long)&pg->cell6 + (ulong)priorprior * 2) >> 0x18) {
      if (((nprior != 0) && (priorprior < nprior)) && (nprior <= priorprior + 0xe)) {
        carcell._4_4_ = priorprior;
        uVar1 = *(uint *)((long)&pg->cell6 + (ulong)priorprior * 2);
        while (carcell._0_4_ = uVar1 >> 0x18, priorprior < (uint)carcell && (uint)carcell < nprior)
        {
          noffset = priorprior;
          carcell._4_4_ = nprior;
          uVar1 = *(uint *)((long)&pg->cell6 + (ulong)(uint)carcell * 2);
          priorprior = (uint)carcell;
        }
        pCVar2 = (ConsCell *)((long)&pg->cell6 + (ulong)priorprior * 2);
        pLVar3 = (LispPTR *)((long)&pg->cell6 + (ulong)nprior * 2);
        if (poffset == 0) {
          *(uint *)&pg->field_0x8 =
               *(uint *)&pg->field_0x8 & 0xff00ffff |
               (*(uint *)((long)&pg->cell6 + (ulong)carcell._4_4_ * 2) >> 0x18) << 0x10;
        }
        else {
          *(uint *)((long)&pg->cell6 + (ulong)poffset * 2) =
               *(uint *)((long)&pg->cell6 + (ulong)poffset * 2) & 0xffffff |
               *(uint *)((long)&pg->cell6 + (ulong)carcell._4_4_ * 2) & 0xff000000;
        }
        if (noffset != 0) {
          *(uint *)((long)&pg->cell6 + (ulong)noffset * 2) =
               *(uint *)((long)&pg->cell6 + (ulong)noffset * 2) & 0xffffff |
               *(uint *)((long)&pg->cell6 + (ulong)priorprior * 2) & 0xff000000;
        }
        *(uint *)&pg->field_0x8 =
             *(uint *)&pg->field_0x8 & 0xffffff |
             ((*(uint *)&pg->field_0x8 >> 0x18) - 2) * 0x1000000;
        *(LispPTR *)&pCVar2->field_0x0 = carpart;
        *pLVar3 = cdrpart;
        *(uint *)&pCVar2->field_0x0 =
             *(uint *)&pCVar2->field_0x0 & 0xfffffff |
             (int)((long)pLVar3 - (long)pCVar2 >> 2) << 0x1c;
        return pCVar2;
      }
      if (((nprior != 0) && (nprior < priorprior)) && (priorprior <= nprior + 0xe)) {
        pCVar2 = (ConsCell *)((long)&pg->cell6 + (ulong)nprior * 2);
        puVar4 = (uint *)((long)&pg->cell6 + (ulong)priorprior * 2);
        if (poffset == 0) {
          *(uint *)&pg->field_0x8 = *(uint *)&pg->field_0x8 & 0xff00ffff | (*puVar4 >> 0x18) << 0x10
          ;
        }
        else {
          *(uint *)((long)&pg->cell6 + (ulong)poffset * 2) =
               *(uint *)((long)&pg->cell6 + (ulong)poffset * 2) & 0xffffff | *puVar4 & 0xff000000;
        }
        *(uint *)&pg->field_0x8 =
             *(uint *)&pg->field_0x8 & 0xffffff |
             ((*(uint *)&pg->field_0x8 >> 0x18) - 2) * 0x1000000;
        *(LispPTR *)&pCVar2->field_0x0 = carpart;
        *puVar4 = cdrpart;
        *(uint *)&pCVar2->field_0x0 =
             *(uint *)&pCVar2->field_0x0 & 0xfffffff |
             (int)((long)puVar4 - (long)pCVar2 >> 2) << 0x1c;
        return pCVar2;
      }
      poffset = nprior;
      nprior = priorprior;
    }
  }
  return (ConsCell *)0x0;
}

Assistant:

static ConsCell *find_cdrpair_in_page(struct conspage *pg, LispPTR carpart, LispPTR cdrpart) {
  unsigned offset, prior, priorprior, nprior, poffset, noffset;

  prior = priorprior = nprior = 0;

  if (pg->count < 2) return (ConsCell *)0;

  offset = pg->next_cell;

  while (offset) {
    if (prior && (offset < prior) && (prior <= offset + 14)) {
      ConsCell *carcell, *cdrcell;

      poffset = offset;
      noffset = FREECONS(pg, offset)->next_free;
      while ((noffset > offset) && (noffset < prior)) {
        nprior = offset;
        poffset = prior;
        offset = noffset;
        noffset = FREECONS(pg, offset)->next_free;
      }

      carcell = (ConsCell *)(((DLword *)pg) + offset);
      cdrcell = (ConsCell *)(((DLword *)pg) + prior);
      if (priorprior)
        FREECONS(pg, priorprior)->next_free = FREECONS(pg, poffset)->next_free;
      else
        pg->next_cell = FREECONS(pg, poffset)->next_free;

      if (nprior) FREECONS(pg, nprior)->next_free = FREECONS(pg, offset)->next_free;

      pg->count -= 2;

      *(LispPTR *)carcell = carpart;
      *(LispPTR *)cdrcell = cdrpart;

      carcell->cdr_code = (cdrcell - carcell);
      return (carcell);
    } else if (prior && (offset > prior) && (offset <= prior + 14)) {
      ConsCell *carcell, *cdrcell;

      carcell = (ConsCell *)(((DLword *)pg) + prior);
      cdrcell = (ConsCell *)(((DLword *)pg) + offset);
      if (priorprior)
        FREECONS(pg, priorprior)->next_free = ((freecons *)cdrcell)->next_free;
      else
        pg->next_cell = ((freecons *)cdrcell)->next_free;

      pg->count -= 2;

      *(LispPTR *)carcell = carpart;
      *(LispPTR *)cdrcell = cdrpart;

      carcell->cdr_code = (cdrcell - carcell);
      return (carcell);
    }
    priorprior = prior;
    prior = offset;
    offset = FREECONS(pg, offset)->next_free;
  }

  return (0); /* found no entries in this page, so return failure code */
}